

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall ddd::DaTrie<false,_false,_false>::pop_block_(DaTrie<false,_false,_false> *this)

{
  long in_RDI;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *unaff_retaddr;
  uint32_t i;
  uint32_t block_pos;
  undefined4 local_10;
  
  num_blocks((DaTrie<false,_false,_false> *)0x152d97);
  pop_block_(this,block_pos,unaff_retaddr);
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::pop_back
              ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x152dcd);
  }
  std::vector<ddd::Block,_std::allocator<ddd::Block>_>::pop_back
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)0x152de7);
  *(int *)(in_RDI + 100) = *(int *)(in_RDI + 100) + -0x100;
  return;
}

Assistant:

void pop_block_() {
    assert(!bc_.empty());

    auto block_pos = num_blocks() - 1;
    pop_block_(block_pos, blocks_);

    for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
      bc_.pop_back();
    }
    if (WithNLM) {
      for (uint32_t i = 0; i < BLOCK_SIZE; ++i) {
        node_links_.pop_back();
      }
    }

    blocks_.pop_back();
    bc_emps_ -= BLOCK_SIZE;
  }